

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

array * cs_impl::path_cs_ext::scan(array *__return_storage_ptr__,string *path)

{
  DIR *__dirp;
  dirent *pdVar1;
  long *plVar2;
  any aStack_98;
  uint *local_90;
  long local_88;
  uint local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  array entries;
  
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_Deque_base
              (&entries.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>);
    pdVar1 = readdir(__dirp);
    while (pdVar1 != (dirent *)0x0) {
      any::make<cs_impl::path_cs_ext::path_info,char(&)[256],unsigned_char&>
                (&aStack_98,&pdVar1->d_name,&pdVar1->d_type);
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                (&entries,&aStack_98);
      any::recycle(&aStack_98);
      pdVar1 = readdir(__dirp);
    }
    closedir(__dirp);
    std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_Deque_base
              (&__return_storage_ptr__->
                super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>,
               &entries.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque(&entries);
    return __return_storage_ptr__;
  }
  plVar2 = (long *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string((string *)&local_90,"Path does not exist.",(allocator *)&entries);
  *plVar2 = (long)(plVar2 + 2);
  if (local_90 == &local_80) {
    *(uint *)(plVar2 + 2) = local_80;
    *(undefined4 *)((long)plVar2 + 0x14) = uStack_7c;
    *(undefined4 *)(plVar2 + 3) = uStack_78;
    *(undefined4 *)((long)plVar2 + 0x1c) = uStack_74;
  }
  else {
    *plVar2 = (long)local_90;
    plVar2[2] = CONCAT44(uStack_7c,local_80);
  }
  plVar2[1] = local_88;
  local_88 = 0;
  local_80 = local_80 & 0xffffff00;
  local_90 = &local_80;
  __cxa_throw(plVar2,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
}

Assistant:

array scan(const string &path)
		{
			DIR *dir = ::opendir(path.c_str());
			if (dir == nullptr)
				throw cs::lang_error("Path does not exist.");
			array
			entries;
			for (dirent *dp = ::readdir(dir); dp != nullptr; dp = ::readdir(dir))
				entries.push_back(var::make<path_info>(dp->d_name, dp->d_type));
			::closedir(dir);
			return std::move(entries);
		}